

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O2

BVIndex __thiscall BVStatic<4096UL>::GetNextBit(BVStatic<4096UL> *this,BVIndex i)

{
  ulong uVar1;
  long lVar2;
  BVIndex BVar3;
  Type *this_00;
  int iVar4;
  
  AssertRange(this,i);
  this_00 = BitsFromIndex(this,i);
  BVar3 = BVUnitT<unsigned_long>::GetNextBit(this_00,i & 0x3f);
  if (BVar3 == 0xffffffff) {
    iVar4 = -(i & 0xffffffc0);
    do {
      this_00 = this_00 + 1;
      if ((BVStatic<4096UL> *)this_00 == this + 1) {
        return 0xffffffff;
      }
      uVar1 = this_00->word;
      iVar4 = iVar4 + -0x40;
    } while (uVar1 == 0);
    lVar2 = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    BVar3 = (int)lVar2 - iVar4;
  }
  else {
    BVar3 = BVar3 + (i & 0xffffffc0);
  }
  return BVar3;
}

Assistant:

BVIndex GetNextBit(BVIndex i) const
    {
        AssertRange(i);

        const BVUnit * chunk = BitsFromIndex(i);
        BVIndex base = BVUnit::Floor(i);

        BVIndex offset = chunk->GetNextBit(BVUnit::Offset(i));
        if (-1 != offset)
        {
            return base + offset;
        }

        while (++chunk != this->EndUnit())
        {
            base += BVUnit::BitsPerWord;
            offset = chunk->GetNextBit();
            if (-1 != offset)
            {
                return base + offset;
            }
        }

       return BVInvalidIndex;
    }